

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O3

int run_test_pipe_bind_or_listen_error_after_close(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 *unaff_RBX;
  long *plVar3;
  code **ppcVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t server;
  code *pcStack_478;
  long lStack_470;
  long lStack_468;
  long alStack_460 [13];
  undefined1 auStack_3f8 [232];
  long alStack_310 [64];
  code *pcStack_110;
  long local_100;
  long local_f8;
  undefined1 local_f0 [232];
  
  pcStack_110 = (code *)0x1b0669;
  uVar2 = uv_default_loop();
  pcStack_110 = (code *)0x1b0678;
  iVar1 = uv_pipe_init(uVar2,local_f0,0);
  local_f8 = (long)iVar1;
  local_100 = 0;
  if (local_f8 == 0) {
    unaff_RBX = local_f0;
    pcStack_110 = (code *)0x1b06a7;
    uv_close(unaff_RBX,0);
    pcStack_110 = (code *)0x1b06b6;
    iVar1 = uv_pipe_bind(unaff_RBX,"/tmp/uv-test-sock");
    local_f8 = (long)iVar1;
    local_100 = -0x16;
    if (local_f8 != -0x16) goto LAB_001b07a1;
    pcStack_110 = (code *)0x1b06e7;
    iVar1 = uv_listen(local_f0,0x1000,0);
    local_f8 = (long)iVar1;
    local_100 = -0x16;
    if (local_f8 != -0x16) goto LAB_001b07b0;
    pcStack_110 = (code *)0x1b070c;
    uVar2 = uv_default_loop();
    pcStack_110 = (code *)0x1b0716;
    iVar1 = uv_run(uVar2,0);
    local_f8 = (long)iVar1;
    local_100 = 0;
    if (local_f8 != 0) goto LAB_001b07bf;
    pcStack_110 = (code *)0x1b073b;
    unaff_RBX = (undefined1 *)uv_default_loop();
    pcStack_110 = (code *)0x1b074f;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_110 = (code *)0x1b0759;
    uv_run(unaff_RBX,0);
    local_f8 = 0;
    pcStack_110 = (code *)0x1b0767;
    uVar2 = uv_default_loop();
    pcStack_110 = (code *)0x1b076f;
    iVar1 = uv_loop_close(uVar2);
    local_100 = (long)iVar1;
    if (local_f8 == local_100) {
      pcStack_110 = (code *)0x1b0787;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_110 = (code *)0x1b07a1;
    run_test_pipe_bind_or_listen_error_after_close_cold_1();
LAB_001b07a1:
    pcStack_110 = (code *)0x1b07b0;
    run_test_pipe_bind_or_listen_error_after_close_cold_2();
LAB_001b07b0:
    pcStack_110 = (code *)0x1b07bf;
    run_test_pipe_bind_or_listen_error_after_close_cold_3();
LAB_001b07bf:
    pcStack_110 = (code *)0x1b07ce;
    run_test_pipe_bind_or_listen_error_after_close_cold_4();
  }
  pcStack_110 = run_test_pipe_overlong_path;
  run_test_pipe_bind_or_listen_error_after_close_cold_5();
  plVar3 = &lStack_470;
  pcStack_478 = (code *)0x1b07ea;
  pcStack_110 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_478 = (code *)0x1b07f9;
  iVar1 = uv_pipe_init(uVar2,auStack_3f8,0);
  alStack_310[0] = (long)iVar1;
  alStack_460[0] = 0;
  if (alStack_310[0] == 0) {
    pcStack_478 = (code *)0x1b0839;
    memset(alStack_310,0x40,0x200);
    alStack_460[0] = -0x24;
    pcStack_478 = (code *)0x1b0859;
    iVar1 = uv_pipe_bind2(auStack_3f8,alStack_310,0x200,1);
    lStack_470 = (long)iVar1;
    if (alStack_460[0] != lStack_470) goto LAB_001b0a0d;
    lStack_470 = -0x24;
    pcStack_478 = (code *)0x1b089f;
    iVar1 = uv_pipe_connect2(alStack_460,auStack_3f8,alStack_310,0x200,1,abort);
    lStack_468 = (long)iVar1;
    if (lStack_470 != lStack_468) goto LAB_001b0a1a;
    pcStack_478 = (code *)0x1b08ba;
    uVar2 = uv_default_loop();
    pcStack_478 = (code *)0x1b08c4;
    iVar1 = uv_run(uVar2,0);
    lStack_470 = (long)iVar1;
    lStack_468 = 0;
    if (lStack_470 != 0) goto LAB_001b0a27;
    lStack_470 = -0x16;
    pcStack_478 = (code *)0x1b08fb;
    iVar1 = uv_pipe_bind(auStack_3f8,"");
    lStack_468 = (long)iVar1;
    if (lStack_470 != lStack_468) goto LAB_001b0a34;
    pcStack_478 = (code *)0x1b092e;
    uv_pipe_connect(alStack_460,auStack_3f8,"",connect_overlong_cb);
    pcStack_478 = (code *)0x1b0933;
    uVar2 = uv_default_loop();
    pcStack_478 = (code *)0x1b093d;
    iVar1 = uv_run(uVar2,0);
    lStack_470 = (long)iVar1;
    lStack_468 = 0;
    if (lStack_470 != 0) goto LAB_001b0a41;
    lStack_470 = 1;
    lStack_468 = (long)connect_cb_called;
    if (lStack_468 != 1) goto LAB_001b0a4e;
    lStack_470 = 1;
    lStack_468 = (long)close_cb_called;
    if (lStack_468 == 1) {
      pcStack_478 = (code *)0x1b09a6;
      uVar2 = uv_default_loop();
      pcStack_478 = (code *)0x1b09ba;
      uv_walk(uVar2,close_walk_cb,0);
      pcStack_478 = (code *)0x1b09c4;
      uv_run(uVar2,0);
      lStack_470 = 0;
      pcStack_478 = (code *)0x1b09d1;
      uVar2 = uv_default_loop();
      pcStack_478 = (code *)0x1b09d9;
      iVar1 = uv_loop_close(uVar2);
      lStack_468 = (long)iVar1;
      if (lStack_470 == lStack_468) {
        pcStack_478 = (code *)0x1b09f0;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b0a68;
    }
  }
  else {
    pcStack_478 = (code *)0x1b0a0d;
    run_test_pipe_overlong_path_cold_1();
LAB_001b0a0d:
    pcStack_478 = (code *)0x1b0a1a;
    run_test_pipe_overlong_path_cold_2();
LAB_001b0a1a:
    pcStack_478 = (code *)0x1b0a27;
    run_test_pipe_overlong_path_cold_3();
LAB_001b0a27:
    pcStack_478 = (code *)0x1b0a34;
    run_test_pipe_overlong_path_cold_4();
LAB_001b0a34:
    pcStack_478 = (code *)0x1b0a41;
    run_test_pipe_overlong_path_cold_5();
LAB_001b0a41:
    pcStack_478 = (code *)0x1b0a4e;
    run_test_pipe_overlong_path_cold_6();
LAB_001b0a4e:
    pcStack_478 = (code *)0x1b0a5b;
    run_test_pipe_overlong_path_cold_7();
  }
  pcStack_478 = (code *)0x1b0a68;
  run_test_pipe_overlong_path_cold_8();
LAB_001b0a68:
  iVar1 = (int)&lStack_468;
  pcStack_478 = connect_overlong_cb;
  run_test_pipe_overlong_path_cold_9();
  pcStack_478 = (code *)(long)iVar1;
  if (pcStack_478 == (code *)0xffffffffffffffea) {
    connect_cb_called = connect_cb_called + 1;
    iVar1 = uv_close(*(undefined8 *)((long)plVar3 + 0x50),close_cb);
    return iVar1;
  }
  ppcVar4 = &pcStack_478;
  connect_overlong_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(ppcVar4,0);
  return iVar1;
}

Assistant:

TEST_IMPL(pipe_bind_or_listen_error_after_close) {
  uv_pipe_t server;

  ASSERT_OK(uv_pipe_init(uv_default_loop(), &server, 0));
  uv_close((uv_handle_t*) &server, NULL);

  ASSERT_EQ(uv_pipe_bind(&server, TEST_PIPENAME), UV_EINVAL);

  ASSERT_EQ(uv_listen((uv_stream_t*) &server, SOMAXCONN, NULL), UV_EINVAL);

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}